

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MEdge>
               (Structure *s,MEdge *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_50 [8];
  MEdge read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MEdge *p_local;
  Structure *s_local;
  
  read.crease = '\0';
  read.bweight = '\0';
  read.flag = 0;
  read._28_4_ = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._24_8_ < cnt; read._24_8_ = read._24_8_ + 1) {
    MEdge::MEdge((MEdge *)local_50);
    Structure::Convert<Assimp::Blender::MEdge>(s,(MEdge *)local_50,db);
    MEdge::operator=((MEdge *)cnt_local,(MEdge *)local_50);
    cnt_local = cnt_local + 0x20;
    MEdge::~MEdge((MEdge *)local_50);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }